

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * escapize_string(char *str)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *out;
  int lout;
  int lstr;
  int jj;
  int ii;
  char *str_local;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    iVar1 = (int)sVar2;
    if (iVar1 != 0) {
      out._0_4_ = 4;
      for (lstr = 0; lstr < iVar1; lstr = lstr + 1) {
        switch(str[lstr]) {
        case '\n':
        case '\r':
          out._0_4_ = (uint)out + 6;
          break;
        default:
          out._0_4_ = (uint)out + 1;
          break;
        case '\"':
        case '\'':
          out._0_4_ = (uint)out + 6;
          break;
        case '&':
          out._0_4_ = (uint)out + 5;
          break;
        case '<':
        case '>':
          out._0_4_ = (uint)out + 4;
        }
      }
      pcVar3 = (char *)calloc(1,(long)(int)(uint)out);
      if (pcVar3 == (char *)0x0) {
        fprintf(_stderr,"** escapize_string: failed to alloc %d bytes\n",(ulong)(uint)out);
        return (char *)0x0;
      }
      *pcVar3 = '\'';
      lout = 1;
      for (lstr = 0; lstr < iVar1; lstr = lstr + 1) {
        switch(str[lstr]) {
        case '\n':
          builtin_strncpy(pcVar3 + lout,"&#x0a;",6);
          lout = lout + 6;
          break;
        default:
          pcVar3[lout] = str[lstr];
          lout = lout + 1;
          break;
        case '\r':
          builtin_strncpy(pcVar3 + lout,"&#x0d;",6);
          lout = lout + 6;
          break;
        case '\"':
          builtin_strncpy(pcVar3 + lout,"&quot;",6);
          lout = lout + 6;
          break;
        case '&':
          builtin_strncpy(pcVar3 + lout,"&amp;",5);
          lout = lout + 5;
          break;
        case '\'':
          builtin_strncpy(pcVar3 + lout,"&apos;",6);
          lout = lout + 6;
          break;
        case '<':
          builtin_strncpy(pcVar3 + lout,"&lt;",4);
          lout = lout + 4;
          break;
        case '>':
          builtin_strncpy(pcVar3 + lout,"&gt;",4);
          lout = lout + 4;
        }
      }
      pcVar3[lout] = '\'';
      pcVar3[lout + 1] = '\0';
      return pcVar3;
    }
  }
  pcVar3 = nifti_strdup("\'\'");
  return pcVar3;
}

Assistant:

static char *escapize_string( const char * str )
{
   int ii,jj , lstr,lout ;
   char *out ;

   if( str == NULL || (lstr=(int)strlen(str)) == 0 ){      /* 0 length */
     out = nifti_strdup("''") ; return out ;                /* string?? */
   }

   lout = 4 ;                      /* initialize length of output */
   for( ii=0 ; ii < lstr ; ii++ ){ /* count characters for output */
     switch( str[ii] ){
       case '&':  lout += 5 ; break ;  /* replace '&' with "&amp;" */

       case '<':
       case '>':  lout += 4 ; break ;  /* replace '<' with "&lt;" */

       case '"' :
       case '\'': lout += 6 ; break ;  /* replace '"' with "&quot;" */

       case CR:
       case LF:   lout += 6 ; break ;  /* replace CR with "&#x0d;"
                                                  LF with "&#x0a;" */

       default: lout++ ; break ;      /* copy all other chars */
     }
   }
   out = (char *)calloc(1,lout) ;     /* allocate output string */
   if( !out ){
      fprintf(stderr,"** escapize_string: failed to alloc %d bytes\n",lout);
      return NULL;
   }
   out[0] = '\'' ;                    /* opening quote mark */
   for( ii=0,jj=1 ; ii < lstr ; ii++ ){
      switch( str[ii] ){
         default: out[jj++] = str[ii] ; break ;  /* normal characters */

         case '&':  memcpy(out+jj,"&amp;",5)  ; jj+=5 ; break ;

         case '<':  memcpy(out+jj,"&lt;",4)   ; jj+=4 ; break ;
         case '>':  memcpy(out+jj,"&gt;",4)   ; jj+=4 ; break ;

         case '"' : memcpy(out+jj,"&quot;",6) ; jj+=6 ; break ;

         case '\'': memcpy(out+jj,"&apos;",6) ; jj+=6 ; break ;

         case CR:   memcpy(out+jj,"&#x0d;",6) ; jj+=6 ; break ;
         case LF:   memcpy(out+jj,"&#x0a;",6) ; jj+=6 ; break ;
      }
   }
   out[jj++] = '\''  ;  /* closing quote mark */
   out[jj]   = '\0' ;  /* terminate the string */
   return out ;
}